

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitStream.hpp
# Opt level: O2

char __thiscall
rc::detail::BitStream<rc::Random>::next<char>(BitStream<rc::Random> *this,uint nbits)

{
  uint uVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  
  uVar4 = 8;
  if ((int)nbits < 8) {
    uVar4 = nbits;
  }
  if (nbits == 0) {
    bVar3 = 0;
  }
  else {
    bVar3 = 0;
    for (uVar7 = uVar4; 0 < (int)uVar7; uVar7 = uVar7 - uVar1) {
      uVar5 = this->m_numBits;
      if (uVar5 == 0) {
        uVar2 = Random::next(&this->m_source);
        this->m_bits = uVar2;
        uVar5 = this->m_numBits + 0x40;
      }
      else {
        uVar2 = this->m_bits;
      }
      uVar1 = uVar5;
      if ((int)uVar7 < (int)uVar5) {
        uVar1 = uVar7;
      }
      bVar6 = ~(byte)(-1L << ((byte)uVar1 & 0x3f));
      if (0x3f < (int)uVar1) {
        bVar6 = 0xff;
      }
      if (uVar1 < 0x40) {
        this->m_bits = uVar2 >> ((byte)uVar1 & 0x3f);
      }
      bVar3 = bVar3 | ((byte)uVar2 & bVar6) << ((byte)uVar4 - (char)uVar7 & 0x3f);
      this->m_numBits = uVar5 - uVar1;
    }
    if (((0x1000000 << ((byte)(uVar4 * 0x1000000 + -0x1000000 >> 0x18) & 0x1f)) >> 0x18 &
        (int)(char)bVar3) != 0) {
      bVar6 = 0;
      if ((int)nbits < 8) {
        bVar6 = (byte)(0xff << ((byte)uVar4 & 0x1f));
      }
      bVar3 = bVar3 | bVar6;
    }
  }
  return bVar3;
}

Assistant:

T BitStream<Source>::next(int nbits, std::false_type) {
  using SourceType = decltype(m_source.next());
  nbits = std::min(nbits, numBits<T>());

  if (nbits == 0) {
    return 0;
  }

  T value = 0;
  int wantBits = nbits;
  while (wantBits > 0) {
    // Out of bits, refill
    if (m_numBits == 0) {
      m_bits = m_source.next();
      m_numBits += numBits<SourceType>();
    }

    const auto n = std::min(m_numBits, wantBits);
    const auto bits = m_bits & bitMask<SourceType>(n);
    value |= (bits << (nbits - wantBits));
    // To avoid right-shifting data beyond the width of the given type (which is
    // undefined behavior, because of course it is) only perform this shift-
    // assignment if we have room.
    if (static_cast<SourceType>(n) <
        static_cast<SourceType>(numBits<SourceType>())) {
      m_bits >>= static_cast<SourceType>(n);
    }
    m_numBits -= n;
    wantBits -= n;
  }

  if (std::is_signed<T>::value) {
    T signBit = static_cast<T>(0x1) << static_cast<T>(nbits - 1);
    if ((value & signBit) != 0) {
      // For signed values, we use the last bit as the sign bit. Since this
      // was 1, mask away by setting all bits above this one to 1 to make it a
      // negative number in 2's complement
      value |= ~bitMask<T>(nbits);
    }
  }

  return value;
}